

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

Vec_Int_t * Gia_ManSwiSimulate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  abctime aVar10;
  Gia_ManSwi_t *p_00;
  abctime aVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  bool bVar14;
  float fVar15;
  abctime clkTotal;
  abctime clk;
  int i;
  float *pSwitching;
  Vec_Int_t *vSwitching;
  Gia_Obj_t *pObj;
  Gia_ManSwi_t *p;
  Gia_ParSwi_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  aVar9 = Abc_Clock();
  if ((pPars->fProbOne != 0) && (pPars->fProbTrans != 0)) {
    printf(
          "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions.\n"
          );
  }
  aVar10 = Abc_Clock();
  p_00 = Gia_ManSwiCreate(pAig,pPars);
  if (pPars->fVerbose != 0) {
    uVar1 = pAig->nObjs;
    iVar4 = Gia_ManCiNum(pAig);
    iVar5 = Gia_ManAndNum(pAig);
    printf("Obj = %8d (%8d). F = %6d. ",(ulong)uVar1,(ulong)(uint)(iVar4 + iVar5),
           (ulong)(uint)p_00->pAig->nFront);
    iVar6 = Gia_ManObjNum(p_00->pAig);
    iVar4 = p_00->nWords;
    iVar5 = p_00->pAig->nFront;
    iVar2 = p_00->nWords;
    iVar7 = Gia_ManCiNum(p_00->pAig);
    iVar8 = Gia_ManCoNum(p_00->pAig);
    printf("AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ",
           ((double)iVar6 * 12.0) / 1048576.0,((double)iVar4 * 4.0 * (double)iVar5) / 1048576.0,
           ((double)iVar2 * 4.0 * (double)(iVar7 + iVar8)) / 1048576.0);
    Abc_Print(1,"%s =","Time");
    aVar11 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar10) * 1.0) / 1000000.0);
  }
  Gia_ManRandom(1);
  Gia_ManSwiSimInfoInit(p_00);
  for (clk._4_4_ = 0;
      (clk._4_4_ < pPars->nIters &&
      (Gia_ManSwiSimulateRound(p_00,(uint)(pPars->nPref <= clk._4_4_)),
      clk._4_4_ != pPars->nIters + -1)); clk._4_4_ = clk._4_4_ + 1) {
    if (pPars->fProbTrans == 0) {
      Gia_ManSwiSimInfoTransfer(p_00,pPars->nRandPiFactor);
    }
    else {
      Gia_ManSwiSimInfoTransferShift(p_00,pPars->nRandPiFactor);
    }
  }
  if (pPars->fVerbose != 0) {
    printf("Simulated %d frames with %d words. ",(ulong)(uint)pPars->nIters,
           (ulong)(uint)pPars->nWords);
    Abc_Print(1,"%s =","Simulation time");
    aVar10 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar9) * 1.0) / 1000000.0);
  }
  iVar4 = Gia_ManObjNum(pAig);
  pVVar12 = Vec_IntStart(iVar4);
  piVar3 = pVVar12->pArray;
  if (pPars->fProbOne == 0) {
    if (pPars->fProbTrans == 0) {
      clk._4_4_ = 0;
      while( true ) {
        bVar14 = false;
        if (clk._4_4_ < pAig->nObjs) {
          pGVar13 = Gia_ManObj(pAig,clk._4_4_);
          bVar14 = pGVar13 != (Gia_Obj_t *)0x0;
        }
        if (!bVar14) break;
        fVar15 = Gia_ManSwiComputeSwitching
                           (p_00->pData1[clk._4_4_],pPars->nWords * (pPars->nIters - pPars->nPref));
        piVar3[clk._4_4_] = (int)fVar15;
        clk._4_4_ = clk._4_4_ + 1;
      }
    }
    else {
      clk._4_4_ = 0;
      while( true ) {
        bVar14 = false;
        if (clk._4_4_ < pAig->nObjs) {
          pGVar13 = Gia_ManObj(pAig,clk._4_4_);
          bVar14 = pGVar13 != (Gia_Obj_t *)0x0;
        }
        if (!bVar14) break;
        fVar15 = Gia_ManSwiComputeProbOne
                           (p_00->pData1[clk._4_4_],pPars->nWords * (pPars->nIters - pPars->nPref));
        piVar3[clk._4_4_] = (int)fVar15;
        clk._4_4_ = clk._4_4_ + 1;
      }
    }
  }
  else {
    clk._4_4_ = 0;
    while( true ) {
      bVar14 = false;
      if (clk._4_4_ < pAig->nObjs) {
        vSwitching = (Vec_Int_t *)Gia_ManObj(pAig,clk._4_4_);
        bVar14 = vSwitching != (Vec_Int_t *)0x0;
      }
      if (!bVar14) break;
      fVar15 = Gia_ManSwiComputeProbOne
                         (p_00->pData1[clk._4_4_],pPars->nWords * (pPars->nIters - pPars->nPref));
      piVar3[clk._4_4_] = (int)fVar15;
      clk._4_4_ = clk._4_4_ + 1;
    }
    clk._4_4_ = 0;
    while( true ) {
      iVar4 = Vec_IntSize(pAig->vCos);
      bVar14 = false;
      if (clk._4_4_ < iVar4) {
        vSwitching = (Vec_Int_t *)Gia_ManCo(pAig,clk._4_4_);
        bVar14 = vSwitching != (Vec_Int_t *)0x0;
      }
      if (!bVar14) break;
      iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)vSwitching);
      if (iVar4 == 0) {
        pGVar13 = Gia_ObjFanin0((Gia_Obj_t *)vSwitching);
        iVar4 = Gia_ObjId(pAig,pGVar13);
        iVar4 = piVar3[iVar4];
        iVar5 = Gia_ObjId(pAig,(Gia_Obj_t *)vSwitching);
        piVar3[iVar5] = iVar4;
      }
      else {
        pGVar13 = Gia_ObjFanin0((Gia_Obj_t *)vSwitching);
        iVar4 = Gia_ObjId(pAig,pGVar13);
        fVar15 = (float)piVar3[iVar4];
        iVar4 = Gia_ObjId(pAig,(Gia_Obj_t *)vSwitching);
        piVar3[iVar4] = (int)(1.0 - fVar15);
      }
      clk._4_4_ = clk._4_4_ + 1;
    }
  }
  Gia_ManSwiDelete(p_00);
  return pVVar12;
}

Assistant:

Vec_Int_t * Gia_ManSwiSimulate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vSwitching;
    float * pSwitching;
    int i;
    abctime clk, clkTotal = Abc_Clock();
    if ( pPars->fProbOne && pPars->fProbTrans )
        printf( "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions.\n" );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManSwiCreate( pAig, pPars );
    if ( pPars->fVerbose )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*p->nWords*p->pAig->nFront/(1<<20), 
            4.0*p->nWords*(Gia_ManCiNum(p->pAig) + Gia_ManCoNum(p->pAig))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManRandom( 1 );
    Gia_ManSwiSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSwiSimulateRound( p, i >= pPars->nPref );
        if ( i == pPars->nIters - 1 )
            break;
        if ( pPars->fProbTrans )
            Gia_ManSwiSimInfoTransferShift( p, pPars->nRandPiFactor );
        else
            Gia_ManSwiSimInfoTransfer( p, pPars->nRandPiFactor );
    }
    if ( pPars->fVerbose )
    {
        printf( "Simulated %d frames with %d words. ", pPars->nIters, pPars->nWords );
        ABC_PRT( "Simulation time", Abc_Clock() - clkTotal );
    }
    // derive the result
    vSwitching = Vec_IntStart( Gia_ManObjNum(pAig) );
    pSwitching = (float *)vSwitching->pArray;
    if ( pPars->fProbOne )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
        Gia_ManForEachCo( pAig, pObj, i )
        {
            if ( Gia_ObjFaninC0(pObj) )
                pSwitching[Gia_ObjId(pAig,pObj)] = (float)1.0-pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
            else
                pSwitching[Gia_ObjId(pAig,pObj)] = pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
        }
    }
    else if ( pPars->fProbTrans )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
    else
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeSwitching( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
/*
    printf( "PI: " );
    Gia_ManForEachPi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LO: " );
    Gia_ManForEachRo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "PO: " );
    Gia_ManForEachPo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LI: " );
    Gia_ManForEachRi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );
*/
    Gia_ManSwiDelete( p );
    return vSwitching;

}